

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLinePath::ArchiveOUT(ChLinePath *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLinePath>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_38._value = (vector<double,_std::allocator<double>_> *)&this->lines;
  local_38._name = "lines";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::geometry::ChLine>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>_>
                       *)&local_38);
  local_38._value = &this->end_times;
  local_38._name = "end_times";
  local_38._flags = '\0';
  ChArchiveOut::out<double>(marchive,&local_38);
  local_38._value = &this->durations;
  local_38._name = "durations";
  local_38._flags = '\0';
  ChArchiveOut::out<double>(marchive,&local_38);
  return;
}

Assistant:

void ChLinePath::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinePath>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(lines);
    marchive << CHNVP(end_times);
    marchive << CHNVP(durations);
}